

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::pixelThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,
               Surface *result,RGBA *threshold,CompareLogMode logMode)

{
  bool bVar1;
  void *pvVar2;
  Vector<unsigned_int,_4> res;
  UVec4 local_a8;
  ConstPixelBufferAccess local_90;
  TextureFormat local_68;
  uint auStack_60 [2];
  ConstPixelBufferAccess local_58;
  
  local_90.m_format.order = RGBA;
  local_90.m_format.type = UNORM_INT8;
  pvVar2 = (void *)(reference->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (reference->m_pixels).m_ptr;
  }
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,&local_90.m_format,reference->m_width,reference->m_height,1,pvVar2);
  local_a8.m_data[0] = RGBA;
  local_a8.m_data[1] = UNORM_INT8;
  pvVar2 = (void *)(result->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (result->m_pixels).m_ptr;
  }
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_90,(TextureFormat *)&local_a8,result->m_width,result->m_height,1,pvVar2);
  RGBA::toIVec((RGBA *)&local_68);
  local_a8.m_data[0] = local_68.order;
  local_a8.m_data[1] = local_68.type;
  local_a8.m_data[2] = auStack_60[0];
  local_a8.m_data[3] = auStack_60[1];
  bVar1 = intThresholdCompare(log,imageSetName,imageSetDesc,&local_58,&local_90,&local_a8,logMode);
  return bVar1;
}

Assistant:

bool pixelThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, const RGBA& threshold, CompareLogMode logMode)
{
	return intThresholdCompare(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), threshold.toIVec().cast<deUint32>(), logMode);
}